

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

bool doctest::detail::binary_assert<0,std::wistream*,std::wistream*>
               (Enum at,char *file,int line,char *expr,
               basic_istream<wchar_t,_std::char_traits<wchar_t>_> **lhs,
               basic_istream<wchar_t,_std::char_traits<wchar_t>_> **rhs)

{
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar1;
  code *pcVar2;
  char extraout_AL;
  undefined1 uVar3;
  bool bVar4;
  ContextOptions *pCVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  ResultBuilder rb;
  String local_e8;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> **local_d0;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *local_c8;
  AssertData local_c0;
  
  pbVar1 = *lhs;
  local_c8 = *rhs;
  local_c0.m_failed = pbVar1 != local_c8;
  local_d0 = rhs;
  if (is_running_in_test == '\0') {
    if (pbVar1 == local_c8) goto LAB_00127509;
    String::String(&local_e8,"");
    ResultBuilder::ResultBuilder((ResultBuilder *)&local_c0,at,file,line,expr,"",&local_e8);
    String::~String(&local_e8);
    stringifyBinaryExpr<std::wistream*,std::wistream*>
              (&local_e8,(detail *)lhs,
               (basic_istream<wchar_t,_std::char_traits<wchar_t>_> **)0x1382b1,(char *)local_d0,
               (basic_istream<wchar_t,_std::char_traits<wchar_t>_> **)expr);
    String::operator=(&local_c0.m_decomp,&local_e8);
    String::~String(&local_e8);
    failed_out_of_a_testing_context(&local_c0);
    bVar4 = isDebuggerActive();
    if (bVar4) {
      pCVar5 = getContextOptions();
      if (pCVar5->no_breaks == false) {
        pcVar2 = (code *)swi(3);
        uVar3 = (*pcVar2)();
        return (bool)uVar3;
      }
    }
    bVar4 = checkIfShouldThrow(at);
    if (bVar4) {
      throwException();
    }
    String::~String((String *)&local_c0.m_exception_string);
  }
  else {
    String::String(&local_e8,"");
    ResultBuilder::ResultBuilder((ResultBuilder *)&local_c0,at,file,line,expr,"",&local_e8);
    String::~String(&local_e8);
    if (pbVar1 == local_c8) {
      pCVar5 = getContextOptions();
      __x = extraout_XMM0_Qa;
      if (pCVar5->success == true) goto LAB_001273af;
    }
    else {
LAB_001273af:
      stringifyBinaryExpr<std::wistream*,std::wistream*>
                (&local_e8,(detail *)lhs,
                 (basic_istream<wchar_t,_std::char_traits<wchar_t>_> **)0x1382b1,(char *)local_d0,
                 (basic_istream<wchar_t,_std::char_traits<wchar_t>_> **)expr);
      String::operator=(&local_c0.m_decomp,&local_e8);
      String::~String(&local_e8);
      __x = extraout_XMM0_Qa_00;
    }
    ResultBuilder::log((ResultBuilder *)&local_c0,__x);
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      uVar3 = (*pcVar2)();
      return (bool)uVar3;
    }
    if (local_c0.m_failed == true) {
      bVar4 = checkIfShouldThrow(at);
      if (bVar4) {
        throwException();
      }
    }
    String::~String((String *)&local_c0.m_exception_string);
  }
  String::~String(&local_c0.m_decomp);
  String::~String(&local_c0.m_exception);
LAB_00127509:
  return pbVar1 == local_c8;
}

Assistant:

DOCTEST_NOINLINE bool binary_assert(assertType::Enum at, const char* file, int line,
                                        const char* expr, const DOCTEST_REF_WRAP(L) lhs,
                                        const DOCTEST_REF_WRAP(R) rhs) {
        bool failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);

        // ###################################################################################
        // IF THE DEBUGGER BREAKS HERE - GO 1 LEVEL UP IN THE CALLSTACK FOR THE FAILING ASSERT
        // THIS IS THE EFFECT OF HAVING 'DOCTEST_CONFIG_SUPER_FAST_ASSERTS' DEFINED
        // ###################################################################################
        DOCTEST_ASSERT_OUT_OF_TESTS(stringifyBinaryExpr(lhs, ", ", rhs));
        DOCTEST_ASSERT_IN_TESTS(stringifyBinaryExpr(lhs, ", ", rhs));
        return !failed;
    }